

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

int tlsio_openssl_init(void)

{
  bool bVar1;
  ulong in_RAX;
  LOGGER_LOG p_Var2;
  LOCK_HANDLE pvVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  LOG_CATEGORY LVar7;
  char *pcVar8;
  
  OPENSSL_init_ssl(0,0);
  OPENSSL_init_ssl(0x200002,0);
  ERR_load_BIO_strings();
  OPENSSL_init_crypto(0xc,0);
  if (openssl_locks == (LOCK_HANDLE *)0x0) {
    openssl_locks = (LOCK_HANDLE *)malloc(8);
    if (openssl_locks != (LOCK_HANDLE *)0x0) {
      bVar4 = true;
      bVar1 = false;
      do {
        bVar6 = bVar1;
        if (!bVar4) goto LAB_0012f1e8;
        pvVar3 = Lock_Init();
        *openssl_locks = pvVar3;
        bVar4 = false;
        bVar1 = true;
      } while (pvVar3 != (LOCK_HANDLE)0x0);
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                  ,"openssl_static_locks_install",0x272,1,"Failed to allocate lock %d",
                  in_RAX & 0xffffffff00000000);
      }
LAB_0012f1e8:
      if (bVar6) {
        return 0;
      }
      goto LAB_0012f12f;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012f12f;
    pcVar8 = "Failed to allocate locks, size:%zu";
    LVar7 = AZ_LOG_ERROR;
    iVar5 = 0x267;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012f12f;
    pcVar8 = "Locks already initialized";
    LVar7 = AZ_LOG_INFO;
    iVar5 = 0x25e;
  }
  (*p_Var2)(LVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
            ,"openssl_static_locks_install",iVar5,1,pcVar8);
LAB_0012f12f:
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_init",0x4dd,1,"Failed to install static locks in OpenSSL!");
  }
  return 0x4de;
}

Assistant:

int tlsio_openssl_init(void)
{
    (void)SSL_library_init();

    SSL_load_error_strings();
    ERR_load_BIO_strings();
    OpenSSL_add_all_algorithms();

    if (openssl_static_locks_install() != 0)
    {
        LogInfo("Failed to install static locks in OpenSSL!");
        return MU_FAILURE;
    }

    openssl_dynamic_locks_install();
    return 0;
}